

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Polyobj_MoveToSpot
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  bool bVar1;
  double dVar2;
  DVector3 local_70;
  TVector2<double> local_58;
  AActor *local_48;
  AActor *spot;
  FActorIterator iterator;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  iterator.id = arg2;
  iterator._12_4_ = arg1;
  FActorIterator::FActorIterator((FActorIterator *)&spot,arg2);
  local_48 = FActorIterator::Next((FActorIterator *)&spot);
  if (local_48 == (AActor *)0x0) {
    ln_local._4_4_ = 0;
  }
  else {
    dVar2 = (double)(int)iterator._12_4_;
    AActor::Pos(&local_70,local_48);
    TVector2<double>::TVector2(&local_58,&local_70);
    bVar1 = EV_MovePolyTo(ln,arg0,dVar2 / 8.0,&local_58,false);
    ln_local._4_4_ = (uint)bVar1;
  }
  return ln_local._4_4_;
}

Assistant:

FUNC(LS_Polyobj_MoveToSpot)
// Polyobj_MoveToSpot (po, speed, tid)
{
	FActorIterator iterator (arg2);
	AActor *spot = iterator.Next();
	if (spot == NULL) return false;
	return EV_MovePolyTo (ln, arg0, SPEED(arg1), spot->Pos(), false);
}